

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation.c
# Opt level: O3

void GetEmpty(Pixel *pixel)

{
  (pixel->color).r = '\0';
  (pixel->color).g = '\0';
  (pixel->color).b = '\0';
  (pixel->color).a = 0xff;
  pixel->pixelType = Empty;
  pixel->density = 0xffffffff;
  pixel->flameable = false;
  return;
}

Assistant:

void GetEmpty(struct Pixel* pixel) {
    pixel->pixelType = Empty;
    pixel->color.a = 255;
    pixel->color.r = 0;
    pixel->color.g = 0;
    pixel->color.b = 0;
    pixel->density = UINT32_MAX;
    pixel->flameable = false;
}